

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O2

int Mop_ManMergeContainAll(Mop_Man_t *p,Vec_Wec_t *vGroups)

{
  int iVar1;
  Vec_Int_t *vGroup;
  Vec_Int_t *vGroup2;
  int i;
  int i_00;
  int iVar2;
  
  iVar1 = vGroups->nSize;
  i = 0;
  iVar2 = 0;
  while (i < iVar1) {
    vGroup = Vec_WecEntry(vGroups,i);
    iVar1 = Mop_ManRemoveIdentical(p,vGroup);
    iVar2 = iVar2 + iVar1;
    i = i + 1;
    for (i_00 = i; iVar1 = vGroups->nSize, i_00 < iVar1; i_00 = i_00 + 1) {
      vGroup2 = Vec_WecEntry(vGroups,i_00);
      iVar1 = Mop_ManMergeContainTwo(p,vGroup,vGroup2);
      iVar2 = iVar2 + iVar1;
    }
  }
  return iVar2;
}

Assistant:

int Mop_ManMergeContainAll( Mop_Man_t * p, Vec_Wec_t * vGroups )
{
    Vec_Int_t * vGroup, * vGroup2;
    int i, k, Count = 0;
    Vec_WecForEachLevel( vGroups, vGroup, i )
    {
        Count += Mop_ManRemoveIdentical( p, vGroup );
        Vec_WecForEachLevelStart( vGroups, vGroup2, k, i+1 )
            Count += Mop_ManMergeContainTwo( p, vGroup, vGroup2 );
    }
    return Count;
}